

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Slice_x86_avx::forward
          (Slice_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *this_00;
  uint uVar1;
  Mat *m;
  ulong _elemsize;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  size_t i;
  ulong uVar18;
  pointer pMVar19;
  int *piVar20;
  size_t i_1;
  undefined4 *puVar21;
  long lVar22;
  undefined4 *puVar23;
  undefined4 *puVar24;
  pointer pMVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  undefined4 *puVar29;
  undefined4 *puVar30;
  long lVar31;
  int iVar32;
  size_t i_7;
  long lVar33;
  void *pvVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  size_t i_2;
  long lVar40;
  bool bVar41;
  void *local_160;
  int local_120;
  Mat bottom_blob_unpacked;
  Mat local_98;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar1 = m->dims;
  _elemsize = m->elemsize;
  iVar36 = m->elempack;
  uVar10 = (ulong)iVar36;
  lVar31 = *(long *)(&this->field_0xd0 + (long)this->_vptr_Slice_x86_avx[-3]);
  iVar15 = *(int *)(&this->field_0x118 + (long)this->_vptr_Slice_x86_avx[-3]);
  if (uVar1 == 1) {
    iVar39 = m->w;
    lVar40 = 0;
    lVar33 = 0;
    uVar18 = 0;
    iVar35 = 0;
    while( true ) {
      pMVar19 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar11 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar19) / 0x48;
      if (uVar11 <= uVar18) break;
      uVar14 = *(uint *)(lVar31 + uVar18 * 4);
      uVar12 = (ulong)uVar14;
      if (uVar14 == 0xffffff17) {
        uVar12 = (ulong)(long)(iVar39 * iVar36 - iVar35) / (uVar11 + lVar40);
      }
      uVar14 = 1;
      if ((opt->use_packing_layout == true) &&
         (uVar14 = (uint)((uVar12 & 3) == 0) * 3 + 1, (uVar12 & 7) == 0)) {
        uVar14 = 8;
      }
      ncnn::Mat::create((Mat *)((long)&pMVar19->data + lVar33),
                        (int)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 |
                                    uVar12 & 0xffffffff) / (long)(int)uVar14),
                        (ulong)uVar14 * (_elemsize / uVar10),uVar14,opt->blob_allocator);
      pvVar34 = *(void **)((long)&pMVar19->data + lVar33);
      if (pvVar34 == (void *)0x0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar19->c + lVar33) * *(long *)((long)&pMVar19->cstep + lVar33) ==
          0) {
        return -100;
      }
      memcpy(pvVar34,(void *)((long)iVar35 * 4 + (long)m->data),
             (long)*(int *)((long)&pMVar19->w + lVar33) *
             *(long *)((long)&pMVar19->elemsize + lVar33));
      iVar35 = (int)uVar12 + iVar35;
      uVar18 = uVar18 + 1;
      lVar33 = lVar33 + 0x48;
      lVar40 = lVar40 + -1;
    }
  }
  iVar15 = (iVar15 >> 0x1f & uVar1) + iVar15;
  if ((uVar1 == 2) && (iVar15 == 0)) {
    iVar39 = m->w;
    lVar33 = (long)iVar39;
    iVar35 = m->h;
    lVar37 = 0;
    lVar40 = 0;
    uVar18 = 0;
    iVar32 = 0;
    while( true ) {
      pMVar19 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar11 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar19) / 0x48;
      if (uVar11 <= uVar18) break;
      uVar14 = *(uint *)(lVar31 + uVar18 * 4);
      uVar12 = (ulong)uVar14;
      if (uVar14 == 0xffffff17) {
        uVar12 = (ulong)(long)(iVar35 * iVar36 - iVar32) / (uVar11 + lVar37);
      }
      lVar17 = 1;
      if ((opt->use_packing_layout == true) &&
         (lVar17 = (ulong)((uVar12 & 3) == 0) * 3 + 1, (uVar12 & 7) == 0)) {
        lVar17 = 8;
      }
      ncnn::Mat::create((Mat *)((long)&pMVar19->data + lVar40),iVar39,
                        (int)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 |
                                    uVar12 & 0xffffffff) / (long)(int)lVar17),
                        lVar17 * (_elemsize / uVar10),(int)lVar17,opt->blob_allocator);
      if (*(long *)((long)&pMVar19->data + lVar40) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar19->c + lVar40) * *(long *)((long)&pMVar19->cstep + lVar40) ==
          0) {
        return -100;
      }
      iVar32 = (int)uVar12 + iVar32;
      uVar18 = uVar18 + 1;
      lVar40 = lVar40 + 0x48;
      lVar37 = lVar37 + -1;
    }
    iVar35 = pMVar19->elempack;
    piVar20 = &pMVar19->elempack;
    while (bVar41 = uVar11 != 0, uVar11 = uVar11 - 1, bVar41) {
      if (*piVar20 < iVar35) {
        iVar35 = *piVar20;
      }
      piVar20 = piVar20 + 0x12;
    }
    ncnn::Mat::Mat(&bottom_blob_unpacked,m);
    if (iVar35 < iVar36) {
      convert_packing(m,&bottom_blob_unpacked,iVar35,opt);
    }
    lVar37 = (long)(iVar39 * 4);
    lVar40 = (long)(iVar39 * 8);
    iVar32 = 0;
    if (0 < iVar39) {
      iVar32 = iVar39;
    }
    local_48 = lVar37 * 4;
    local_50 = lVar37 * 4 + 0xc;
    lVar17 = lVar40 * 4;
    local_40 = (long)(iVar39 * 7) << 2;
    local_38 = (long)(iVar39 * 6) << 2;
    puVar21 = (undefined4 *)bottom_blob_unpacked.data;
    for (uVar18 = 0;
        pMVar19 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar18 < (ulong)(((long)(top_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)pMVar19) / 0x48);
        uVar18 = uVar18 + 1) {
      pMVar25 = pMVar19 + uVar18;
      iVar28 = pMVar19[uVar18].elempack;
      if ((iVar35 == 4) && (iVar28 == 8)) {
        uVar11 = (ulong)(uint)pMVar25->h;
        if (pMVar25->h < 1) {
          uVar11 = 0;
        }
        lVar16 = local_50 + (long)puVar21;
        for (uVar12 = 0; uVar12 != uVar11; uVar12 = uVar12 + 1) {
          lVar22 = pMVar25->elemsize * uVar12 * (long)pMVar25->w;
          pvVar34 = pMVar25->data;
          lVar27 = 0;
          iVar28 = iVar32;
          while (bVar41 = iVar28 != 0, iVar28 = iVar28 + -1, bVar41) {
            *(undefined4 *)((long)pvVar34 + lVar27 * 2 + lVar22) =
                 *(undefined4 *)((long)puVar21 + lVar27);
            *(undefined4 *)((long)pvVar34 + lVar27 * 2 + lVar22 + 4) =
                 *(undefined4 *)((long)puVar21 + lVar27 + 4);
            *(undefined4 *)((long)pvVar34 + lVar27 * 2 + lVar22 + 8) =
                 *(undefined4 *)((long)puVar21 + lVar27 + 8);
            *(undefined4 *)((long)pvVar34 + lVar27 * 2 + lVar22 + 0xc) =
                 *(undefined4 *)((long)puVar21 + lVar27 + 0xc);
            *(undefined4 *)((long)pvVar34 + lVar27 * 2 + lVar22 + 0x10) =
                 *(undefined4 *)(lVar16 + -0xc + lVar27);
            *(undefined4 *)((long)pvVar34 + lVar27 * 2 + lVar22 + 0x14) =
                 *(undefined4 *)(lVar16 + -8 + lVar27);
            *(undefined4 *)((long)pvVar34 + lVar27 * 2 + lVar22 + 0x18) =
                 *(undefined4 *)(lVar16 + -4 + lVar27);
            *(undefined4 *)((long)pvVar34 + lVar27 * 2 + lVar22 + 0x1c) =
                 *(undefined4 *)(lVar16 + lVar27);
            lVar27 = lVar27 + 0x10;
          }
          puVar21 = puVar21 + lVar40;
          lVar16 = lVar16 + lVar17;
        }
        iVar28 = pMVar25->elempack;
      }
      if ((iVar35 == 1) && (iVar28 == 8)) {
        uVar14 = pMVar25->h;
        if (pMVar25->h < 1) {
          uVar14 = 0;
        }
        lVar16 = (long)puVar21 + local_40;
        lVar22 = (long)puVar21 + local_38;
        puVar23 = puVar21 + iVar39 * 5;
        lVar27 = (long)puVar21 + local_48;
        puVar29 = puVar21 + iVar39 * 3;
        puVar30 = puVar21 + iVar39 * 2;
        puVar24 = puVar21 + lVar33;
        for (uVar11 = 0; uVar11 != uVar14; uVar11 = uVar11 + 1) {
          lVar13 = pMVar25->elemsize * uVar11 * (long)pMVar25->w;
          pvVar34 = pMVar25->data;
          lVar38 = 0;
          iVar28 = iVar32;
          while (bVar41 = iVar28 != 0, iVar28 = iVar28 + -1, bVar41) {
            *(undefined4 *)((long)pvVar34 + lVar38 * 8 + lVar13) =
                 *(undefined4 *)((long)puVar21 + lVar38);
            *(undefined4 *)((long)pvVar34 + lVar38 * 8 + lVar13 + 4) =
                 *(undefined4 *)((long)puVar24 + lVar38);
            *(undefined4 *)((long)pvVar34 + lVar38 * 8 + lVar13 + 8) =
                 *(undefined4 *)((long)puVar30 + lVar38);
            *(undefined4 *)((long)pvVar34 + lVar38 * 8 + lVar13 + 0xc) =
                 *(undefined4 *)((long)puVar29 + lVar38);
            *(undefined4 *)((long)pvVar34 + lVar38 * 8 + lVar13 + 0x10) =
                 *(undefined4 *)(lVar27 + lVar38);
            *(undefined4 *)((long)pvVar34 + lVar38 * 8 + lVar13 + 0x14) =
                 *(undefined4 *)((long)puVar23 + lVar38);
            *(undefined4 *)((long)pvVar34 + lVar38 * 8 + lVar13 + 0x18) =
                 *(undefined4 *)(lVar22 + lVar38);
            *(undefined4 *)((long)pvVar34 + lVar38 * 8 + lVar13 + 0x1c) =
                 *(undefined4 *)(lVar16 + lVar38);
            lVar38 = lVar38 + 4;
          }
          puVar21 = puVar21 + lVar40;
          lVar16 = lVar16 + lVar17;
          lVar22 = lVar22 + lVar17;
          puVar23 = puVar23 + lVar40;
          lVar27 = lVar27 + lVar17;
          puVar29 = puVar29 + lVar40;
          puVar30 = puVar30 + lVar40;
          puVar24 = puVar24 + lVar40;
        }
        iVar28 = pMVar25->elempack;
      }
      if ((iVar35 == 1) && (iVar28 == 4)) {
        uVar11 = (ulong)(uint)pMVar25->h;
        if (pMVar25->h < 1) {
          uVar11 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar11; uVar12 = uVar12 + 1) {
          puVar24 = (undefined4 *)
                    ((long)pMVar25->w * uVar12 * pMVar25->elemsize + (long)pMVar25->data);
          puVar29 = puVar21;
          iVar26 = iVar32;
          while (bVar41 = iVar26 != 0, iVar26 = iVar26 + -1, bVar41) {
            *puVar24 = *puVar29;
            puVar24[1] = puVar29[lVar33];
            puVar24[2] = puVar29[iVar39 * 2];
            puVar23 = puVar29 + iVar39 * 3;
            puVar29 = puVar29 + 1;
            puVar24[3] = *puVar23;
            puVar24 = puVar24 + 4;
          }
          puVar21 = puVar21 + lVar37;
        }
      }
      if (iVar35 == iVar28) {
        lVar16 = pMVar25->h * lVar33;
        memcpy(pMVar25->data,puVar21,pMVar25->elemsize * lVar16);
        puVar21 = puVar21 + (long)(int)lVar16 * (long)pMVar25->elempack;
      }
    }
    ncnn::Mat::~Mat(&bottom_blob_unpacked);
  }
  if ((uVar1 == 2) && (iVar15 == 1)) {
    iVar39 = m->w;
    uVar14 = m->h;
    lVar40 = 0;
    lVar33 = 0;
    iVar35 = 0;
    uVar18 = 0;
    while( true ) {
      pMVar19 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar25 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      uVar11 = ((long)pMVar25 - (long)pMVar19) / 0x48;
      if (uVar11 <= uVar18) break;
      iVar32 = *(int *)(lVar31 + uVar18 * 4);
      if (iVar32 == -0xe9) {
        iVar32 = (int)((ulong)((long)iVar39 - (long)iVar35) / (uVar11 + lVar40));
      }
      ncnn::Mat::create((Mat *)((long)&pMVar19->data + lVar33),iVar32,uVar14,_elemsize,iVar36,
                        opt->blob_allocator);
      if (*(long *)((long)&pMVar19->data + lVar33) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar19->c + lVar33) * *(long *)((long)&pMVar19->cstep + lVar33) ==
          0) {
        return -100;
      }
      iVar35 = iVar32 + iVar35;
      uVar18 = uVar18 + 1;
      lVar33 = lVar33 + 0x48;
      lVar40 = lVar40 + -1;
    }
    uVar11 = 0;
    uVar18 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar18 = uVar11;
    }
    for (; uVar11 != uVar18; uVar11 = uVar11 + 1) {
      pvVar34 = (void *)((long)m->w * uVar11 * m->elemsize + (long)m->data);
      lVar33 = 0x2c;
      for (uVar12 = 0; uVar12 < (ulong)(((long)pMVar25 - (long)pMVar19) / 0x48); uVar12 = uVar12 + 1
          ) {
        lVar40 = (long)*(int *)((long)&pMVar19->data + lVar33);
        memcpy((void *)(uVar11 * lVar40 * *(long *)((long)pMVar19 + lVar33 + -0x1c) +
                       *(long *)((long)pMVar19 + lVar33 + -0x2c)),pvVar34,lVar40 * _elemsize);
        pvVar34 = (void *)((long)pvVar34 +
                          (long)*(int *)((long)&pMVar19->data + lVar33) * uVar10 * 4);
        pMVar19 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar25 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar33 = lVar33 + 0x48;
      }
    }
  }
  if ((uVar1 == 3) && (iVar15 == 0)) {
    iVar39 = m->w;
    iVar35 = m->h;
    iVar32 = m->c;
    lVar33 = 0;
    lVar40 = 0;
    iVar28 = 0;
    uVar18 = 0;
    while( true ) {
      pMVar19 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar11 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar19) / 0x48;
      if (uVar11 <= uVar18) break;
      uVar14 = *(uint *)(lVar31 + uVar18 * 4);
      uVar12 = (ulong)uVar14;
      if (uVar14 == 0xffffff17) {
        uVar12 = (ulong)(long)(iVar32 * iVar36 - iVar28) / (uVar11 + lVar33);
      }
      lVar37 = 1;
      if ((opt->use_packing_layout == true) &&
         (lVar37 = (ulong)((uVar12 & 3) == 0) * 3 + 1, (uVar12 & 7) == 0)) {
        lVar37 = 8;
      }
      ncnn::Mat::create((Mat *)((long)&pMVar19->data + lVar40),iVar39,iVar35,
                        (int)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 |
                                    uVar12 & 0xffffffff) / (long)(int)lVar37),
                        lVar37 * (_elemsize / uVar10),(int)lVar37,opt->blob_allocator);
      if (*(long *)((long)&pMVar19->data + lVar40) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar19->c + lVar40) * *(long *)((long)&pMVar19->cstep + lVar40) ==
          0) {
        return -100;
      }
      iVar28 = (int)uVar12 + iVar28;
      uVar18 = uVar18 + 1;
      lVar40 = lVar40 + 0x48;
      lVar33 = lVar33 + -1;
    }
    local_120 = pMVar19->elempack;
    piVar20 = &pMVar19->elempack;
    while (bVar41 = uVar11 != 0, uVar11 = uVar11 - 1, bVar41) {
      if (*piVar20 < local_120) {
        local_120 = *piVar20;
      }
      piVar20 = piVar20 + 0x12;
    }
    ncnn::Mat::Mat(&bottom_blob_unpacked,m);
    if (local_120 < iVar36) {
      convert_packing(m,&bottom_blob_unpacked,local_120,opt);
    }
    iVar39 = 0;
    for (uVar18 = 0;
        pMVar19 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar18 < (ulong)(((long)(top_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)pMVar19) / 0x48);
        uVar18 = uVar18 + 1) {
      this_00 = pMVar19 + uVar18;
      iVar35 = pMVar19[uVar18].elempack;
      if ((local_120 == 4) && (iVar35 == 8)) {
        iVar35 = this_00->h * this_00->w;
        iVar32 = 0;
        if (iVar35 < 1) {
          iVar35 = 0;
        }
        for (; iVar32 < this_00->c; iVar32 = iVar32 + 1) {
          ncnn::Mat::channel(&local_98,&bottom_blob_unpacked,iVar39);
          pvVar34 = local_98.data;
          ncnn::Mat::~Mat(&local_98);
          ncnn::Mat::channel(&local_98,&bottom_blob_unpacked,iVar39 + 1);
          pvVar3 = local_98.data;
          ncnn::Mat::~Mat(&local_98);
          ncnn::Mat::channel(&local_98,this_00,iVar32);
          pvVar4 = local_98.data;
          ncnn::Mat::~Mat(&local_98);
          lVar33 = 0;
          iVar28 = iVar35;
          while (bVar41 = iVar28 != 0, iVar28 = iVar28 + -1, bVar41) {
            *(undefined4 *)((long)pvVar4 + lVar33 * 2) = *(undefined4 *)((long)pvVar34 + lVar33);
            *(undefined4 *)((long)pvVar4 + lVar33 * 2 + 4) =
                 *(undefined4 *)((long)pvVar34 + lVar33 + 4);
            *(undefined4 *)((long)pvVar4 + lVar33 * 2 + 8) =
                 *(undefined4 *)((long)pvVar34 + lVar33 + 8);
            *(undefined4 *)((long)pvVar4 + lVar33 * 2 + 0xc) =
                 *(undefined4 *)((long)pvVar34 + lVar33 + 0xc);
            *(undefined4 *)((long)pvVar4 + lVar33 * 2 + 0x10) =
                 *(undefined4 *)((long)pvVar3 + lVar33);
            *(undefined4 *)((long)pvVar4 + lVar33 * 2 + 0x14) =
                 *(undefined4 *)((long)pvVar3 + lVar33 + 4);
            *(undefined4 *)((long)pvVar4 + lVar33 * 2 + 0x18) =
                 *(undefined4 *)((long)pvVar3 + lVar33 + 8);
            *(undefined4 *)((long)pvVar4 + lVar33 * 2 + 0x1c) =
                 *(undefined4 *)((long)pvVar3 + lVar33 + 0xc);
            lVar33 = lVar33 + 0x10;
          }
          iVar39 = iVar39 + 2;
        }
        iVar35 = this_00->elempack;
      }
      if ((local_120 == 1) && (iVar35 == 8)) {
        iVar35 = this_00->h * this_00->w;
        iVar32 = 0;
        if (iVar35 < 1) {
          iVar35 = iVar32;
        }
        while( true ) {
          if (this_00->c <= iVar32) break;
          ncnn::Mat::channel(&local_98,&bottom_blob_unpacked,iVar39);
          pvVar34 = local_98.data;
          ncnn::Mat::~Mat(&local_98);
          ncnn::Mat::channel(&local_98,&bottom_blob_unpacked,iVar39 + 1);
          pvVar3 = local_98.data;
          ncnn::Mat::~Mat(&local_98);
          ncnn::Mat::channel(&local_98,&bottom_blob_unpacked,iVar39 + 2);
          pvVar4 = local_98.data;
          ncnn::Mat::~Mat(&local_98);
          ncnn::Mat::channel(&local_98,&bottom_blob_unpacked,iVar39 + 3);
          pvVar5 = local_98.data;
          ncnn::Mat::~Mat(&local_98);
          ncnn::Mat::channel(&local_98,&bottom_blob_unpacked,iVar39 + 4);
          pvVar6 = local_98.data;
          ncnn::Mat::~Mat(&local_98);
          ncnn::Mat::channel(&local_98,&bottom_blob_unpacked,iVar39 + 5);
          pvVar7 = local_98.data;
          ncnn::Mat::~Mat(&local_98);
          ncnn::Mat::channel(&local_98,&bottom_blob_unpacked,iVar39 + 6);
          pvVar8 = local_98.data;
          ncnn::Mat::~Mat(&local_98);
          ncnn::Mat::channel(&local_98,&bottom_blob_unpacked,iVar39 + 7);
          pvVar9 = local_98.data;
          ncnn::Mat::~Mat(&local_98);
          ncnn::Mat::channel(&local_98,this_00,iVar32);
          puVar21 = (undefined4 *)local_98.data;
          ncnn::Mat::~Mat(&local_98);
          for (lVar33 = 0; iVar35 != (int)lVar33; lVar33 = lVar33 + 1) {
            *puVar21 = *(undefined4 *)((long)pvVar34 + lVar33 * 4);
            puVar21[1] = *(undefined4 *)((long)pvVar3 + lVar33 * 4);
            puVar21[2] = *(undefined4 *)((long)pvVar4 + lVar33 * 4);
            puVar21[3] = *(undefined4 *)((long)pvVar5 + lVar33 * 4);
            puVar21[4] = *(undefined4 *)((long)pvVar6 + lVar33 * 4);
            puVar21[5] = *(undefined4 *)((long)pvVar7 + lVar33 * 4);
            puVar21[6] = *(undefined4 *)((long)pvVar8 + lVar33 * 4);
            puVar21[7] = *(undefined4 *)((long)pvVar9 + lVar33 * 4);
            puVar21 = puVar21 + 8;
          }
          iVar39 = iVar39 + 8;
          iVar32 = iVar32 + 1;
        }
        iVar35 = this_00->elempack;
      }
      if ((local_120 == 1) && (iVar35 == 4)) {
        iVar32 = this_00->h * this_00->w;
        iVar35 = 0;
        if (iVar32 < 1) {
          iVar32 = 0;
        }
        while( true ) {
          if (this_00->c <= iVar35) break;
          ncnn::Mat::channel(&local_98,&bottom_blob_unpacked,iVar39);
          pvVar34 = local_98.data;
          ncnn::Mat::~Mat(&local_98);
          ncnn::Mat::channel(&local_98,&bottom_blob_unpacked,iVar39 + 1);
          pvVar3 = local_98.data;
          ncnn::Mat::~Mat(&local_98);
          ncnn::Mat::channel(&local_98,&bottom_blob_unpacked,iVar39 + 2);
          pvVar4 = local_98.data;
          ncnn::Mat::~Mat(&local_98);
          ncnn::Mat::channel(&local_98,&bottom_blob_unpacked,iVar39 + 3);
          pvVar5 = local_98.data;
          ncnn::Mat::~Mat(&local_98);
          ncnn::Mat::channel(&local_98,this_00,iVar35);
          puVar21 = (undefined4 *)local_98.data;
          ncnn::Mat::~Mat(&local_98);
          for (lVar33 = 0; iVar32 != (int)lVar33; lVar33 = lVar33 + 1) {
            *puVar21 = *(undefined4 *)((long)pvVar34 + lVar33 * 4);
            puVar21[1] = *(undefined4 *)((long)pvVar3 + lVar33 * 4);
            puVar21[2] = *(undefined4 *)((long)pvVar4 + lVar33 * 4);
            puVar21[3] = *(undefined4 *)((long)pvVar5 + lVar33 * 4);
            puVar21 = puVar21 + 4;
          }
          iVar39 = iVar39 + 4;
          iVar35 = iVar35 + 1;
        }
        iVar35 = this_00->elempack;
      }
      if (local_120 == iVar35) {
        sVar2 = this_00->cstep;
        iVar35 = this_00->c;
        ncnn::Mat::channel(&local_98,&bottom_blob_unpacked,iVar39);
        pvVar34 = local_98.data;
        ncnn::Mat::~Mat(&local_98);
        memcpy(this_00->data,pvVar34,(long)((int)sVar2 * iVar35) * this_00->elemsize);
        iVar39 = iVar39 + this_00->c;
      }
    }
    ncnn::Mat::~Mat(&bottom_blob_unpacked);
  }
  if ((uVar1 == 3) && (iVar15 == 1)) {
    iVar39 = m->w;
    iVar35 = m->c;
    iVar32 = m->h;
    lVar40 = 0;
    lVar33 = 0;
    iVar28 = 0;
    uVar18 = 0;
    while( true ) {
      pMVar19 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar11 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar19) / 0x48;
      if (uVar11 <= uVar18) break;
      iVar26 = *(int *)(lVar31 + uVar18 * 4);
      if (iVar26 == -0xe9) {
        iVar26 = (int)((ulong)((long)iVar32 - (long)iVar28) / (uVar11 + lVar40));
      }
      ncnn::Mat::create((Mat *)((long)&pMVar19->data + lVar33),iVar39,iVar26,iVar35,_elemsize,iVar36
                        ,opt->blob_allocator);
      if (*(long *)((long)&pMVar19->data + lVar33) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar19->c + lVar33) * *(long *)((long)&pMVar19->cstep + lVar33) ==
          0) {
        return -100;
      }
      iVar28 = iVar26 + iVar28;
      uVar18 = uVar18 + 1;
      lVar33 = lVar33 + 0x48;
      lVar40 = lVar40 + -1;
    }
    iVar39 = 0;
    if (iVar35 < 1) {
      iVar35 = 0;
    }
    for (; iVar39 != iVar35; iVar39 = iVar39 + 1) {
      ncnn::Mat::channel(&bottom_blob_unpacked,m,iVar39);
      pvVar34 = bottom_blob_unpacked.data;
      ncnn::Mat::~Mat(&bottom_blob_unpacked);
      lVar33 = 0;
      for (uVar18 = 0;
          pMVar19 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start,
          uVar18 < (ulong)(((long)(top_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar19) / 0x48);
          uVar18 = uVar18 + 1) {
        lVar40 = (long)*(int *)((long)&pMVar19->h + lVar33) *
                 (long)*(int *)((long)&pMVar19->w + lVar33);
        ncnn::Mat::channel(&bottom_blob_unpacked,(Mat *)((long)&pMVar19->data + lVar33),iVar39);
        pvVar3 = bottom_blob_unpacked.data;
        ncnn::Mat::~Mat(&bottom_blob_unpacked);
        memcpy(pvVar3,pvVar34,lVar40 * _elemsize);
        pvVar34 = (void *)((long)pvVar34 + (long)((int)lVar40 * iVar36) * 4);
        lVar33 = lVar33 + 0x48;
      }
    }
  }
  if ((uVar1 == 3) && (iVar15 == 2)) {
    iVar15 = m->w;
    uVar1 = m->h;
    iVar39 = m->c;
    lVar40 = 0;
    lVar33 = 0;
    iVar35 = 0;
    uVar18 = 0;
    while( true ) {
      pMVar19 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar11 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar19) / 0x48;
      if (uVar11 <= uVar18) break;
      iVar32 = *(int *)(lVar31 + uVar18 * 4);
      if (iVar32 == -0xe9) {
        iVar32 = (int)((ulong)((long)iVar15 - (long)iVar35) / (uVar11 + lVar40));
      }
      ncnn::Mat::create((Mat *)((long)&pMVar19->data + lVar33),iVar32,uVar1,iVar39,_elemsize,iVar36,
                        opt->blob_allocator);
      if ((*(long *)((long)&pMVar19->data + lVar33) == 0) ||
         ((long)*(int *)((long)&pMVar19->c + lVar33) * *(long *)((long)&pMVar19->cstep + lVar33) ==
          0)) {
        return -100;
      }
      iVar35 = iVar32 + iVar35;
      uVar18 = uVar18 + 1;
      lVar33 = lVar33 + 0x48;
      lVar40 = lVar40 + -1;
    }
    uVar18 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar18 = 0;
    }
    if (iVar39 < 1) {
      iVar39 = 0;
    }
    for (iVar36 = 0; iVar36 != iVar39; iVar36 = iVar36 + 1) {
      ncnn::Mat::channel(&bottom_blob_unpacked,m,iVar36);
      local_160 = bottom_blob_unpacked.data;
      ncnn::Mat::~Mat(&bottom_blob_unpacked);
      for (uVar11 = 0; uVar11 != uVar18; uVar11 = uVar11 + 1) {
        lVar31 = 0;
        for (uVar12 = 0;
            pMVar19 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start,
            uVar12 < (ulong)(((long)(top_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar19) /
                            0x48); uVar12 = uVar12 + 1) {
          ncnn::Mat::channel(&bottom_blob_unpacked,(Mat *)((long)&pMVar19->data + lVar31),iVar36);
          pvVar34 = (void *)((long)bottom_blob_unpacked.w * uVar11 * bottom_blob_unpacked.elemsize +
                            (long)bottom_blob_unpacked.data);
          ncnn::Mat::~Mat(&bottom_blob_unpacked);
          memcpy(pvVar34,local_160,(long)*(int *)((long)&pMVar19->w + lVar31) * _elemsize);
          local_160 = (void *)((long)local_160 +
                              (long)*(int *)((long)&pMVar19->w + lVar31) * uVar10 * 4);
          lVar31 = lVar31 + 0x48;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Slice_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // slice vector
        int w = bottom_blob.w * elempack;
        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, top_blob.w * top_blob.elemsize);

            q += slice;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // slice image height
        int w = bottom_blob.w;
        int h = bottom_blob.h * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        const float* ptr = bottom_blob_unpacked;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    ptr += w * 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = w * top_blob.h;

                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                ptr += size * top_blob.elempack;
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // slice image width
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* ptr = bottom_blob.row<const float>(j);
            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                float* outptr = top_blob.row(j);
                memcpy(outptr, ptr, top_blob.w * elemsize);

                ptr += top_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // slice dim channel
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        int p = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    p += 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = top_blob.total();

                const float* ptr = bottom_blob_unpacked.channel(p);
                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                p += top_blob.c;
            }
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // slice dim height
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                int size = top_blob.w * top_blob.h;

                float* outptr = top_blob.channel(p);
                memcpy(outptr, ptr, size * elemsize);

                ptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // slice dim width
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < h; j++)
            {
                for (size_t i = 0; i < top_blobs.size(); i++)
                {
                    Mat& top_blob = top_blobs[i];

                    float* outptr = top_blob.channel(p).row(j);
                    memcpy(outptr, ptr, top_blob.w * elemsize);

                    ptr += top_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}